

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O3

bool __thiscall google::protobuf::compiler::python::IsWellKnownType(python *this,string_view name)

{
  int iVar1;
  size_type __rlen;
  char *__s1;
  char *__s2;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  __s1 = (char *)name._M_len;
  bVar2 = false;
  switch(this) {
  case (python *)0x13:
    auVar5[0] = -(__s1[3] == 'g');
    auVar5[1] = -(__s1[4] == 'l');
    auVar5[2] = -(__s1[5] == 'e');
    auVar5[3] = -(__s1[6] == '.');
    auVar5[4] = -(__s1[7] == 'p');
    auVar5[5] = -(__s1[8] == 'r');
    auVar5[6] = -(__s1[9] == 'o');
    auVar5[7] = -(__s1[10] == 't');
    auVar5[8] = -(__s1[0xb] == 'o');
    auVar5[9] = -(__s1[0xc] == 'b');
    auVar5[10] = -(__s1[0xd] == 'u');
    auVar5[0xb] = -(__s1[0xe] == 'f');
    auVar5[0xc] = -(__s1[0xf] == '.');
    auVar5[0xd] = -(__s1[0x10] == 'A');
    auVar5[0xe] = -(__s1[0x11] == 'n');
    auVar5[0xf] = -(__s1[0x12] == 'y');
    auVar3[0] = -(*__s1 == 'g');
    auVar3[1] = -(__s1[1] == 'o');
    auVar3[2] = -(__s1[2] == 'o');
    auVar3[3] = -(__s1[3] == 'g');
    auVar3[4] = -(__s1[4] == 'l');
    auVar3[5] = -(__s1[5] == 'e');
    auVar3[6] = -(__s1[6] == '.');
    auVar3[7] = -(__s1[7] == 'p');
    auVar3[8] = -(__s1[8] == 'r');
    auVar3[9] = -(__s1[9] == 'o');
    auVar3[10] = -(__s1[10] == 't');
    auVar3[0xb] = -(__s1[0xb] == 'o');
    auVar3[0xc] = -(__s1[0xc] == 'b');
    auVar3[0xd] = -(__s1[0xd] == 'u');
    auVar3[0xe] = -(__s1[0xe] == 'f');
    auVar3[0xf] = -(__s1[0xf] == '.');
    auVar3 = auVar3 & auVar5;
    return (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                   (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) == 0xffff;
  default:
    goto switchD_00e274ef_caseD_14;
  case (python *)0x16:
    __s2 = "google.protobuf.Struct";
    break;
  case (python *)0x18:
    __s2 = "google.protobuf.Duration";
    break;
  case (python *)0x19:
    iVar1 = bcmp(__s1,"google.protobuf.FieldMask",(size_t)this);
    if (iVar1 == 0) {
      return true;
    }
    auVar6[0] = -(__s1[9] == 'o');
    auVar6[1] = -(__s1[10] == 't');
    auVar6[2] = -(__s1[0xb] == 'o');
    auVar6[3] = -(__s1[0xc] == 'b');
    auVar6[4] = -(__s1[0xd] == 'u');
    auVar6[5] = -(__s1[0xe] == 'f');
    auVar6[6] = -(__s1[0xf] == '.');
    auVar6[7] = -(__s1[0x10] == 'L');
    auVar6[8] = -(__s1[0x11] == 'i');
    auVar6[9] = -(__s1[0x12] == 's');
    auVar6[10] = -(__s1[0x13] == 't');
    auVar6[0xb] = -(__s1[0x14] == 'V');
    auVar6[0xc] = -(__s1[0x15] == 'a');
    auVar6[0xd] = -(__s1[0x16] == 'l');
    auVar6[0xe] = -(__s1[0x17] == 'u');
    auVar6[0xf] = -(__s1[0x18] == 'e');
    auVar4[0] = -(*__s1 == 'g');
    auVar4[1] = -(__s1[1] == 'o');
    auVar4[2] = -(__s1[2] == 'o');
    auVar4[3] = -(__s1[3] == 'g');
    auVar4[4] = -(__s1[4] == 'l');
    auVar4[5] = -(__s1[5] == 'e');
    auVar4[6] = -(__s1[6] == '.');
    auVar4[7] = -(__s1[7] == 'p');
    auVar4[8] = -(__s1[8] == 'r');
    auVar4[9] = -(__s1[9] == 'o');
    auVar4[10] = -(__s1[10] == 't');
    auVar4[0xb] = -(__s1[0xb] == 'o');
    auVar4[0xc] = -(__s1[0xc] == 'b');
    auVar4[0xd] = -(__s1[0xd] == 'u');
    auVar4[0xe] = -(__s1[0xe] == 'f');
    auVar4[0xf] = -(__s1[0xf] == '.');
    auVar4 = auVar4 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
      return true;
    }
    __s2 = "google.protobuf.Timestamp";
  }
  iVar1 = bcmp(__s1,__s2,(size_t)this);
  bVar2 = iVar1 == 0;
switchD_00e274ef_caseD_14:
  return bVar2;
}

Assistant:

bool IsWellKnownType(const absl::string_view name) {
  // LINT.IfChange(wktbases)
  return (name == "google.protobuf.Any" ||
          name == "google.protobuf.Duration" ||
          name == "google.protobuf.FieldMask" ||
          name == "google.protobuf.ListValue" ||
          name == "google.protobuf.Struct" ||
          name == "google.protobuf.Timestamp");
  // LINT.ThenChange(//depot/google3/net/proto2/python/internal/well_known_types.py:wktbases)
}